

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross.cpp
# Opt level: O1

uint32_t __thiscall
diligent_spirv_cross::Compiler::get_pointee_type_id(Compiler *this,uint32_t type_id)

{
  SPIRType *pSVar1;
  
  pSVar1 = Variant::get<diligent_spirv_cross::SPIRType>
                     ((this->ir).ids.super_VectorView<diligent_spirv_cross::Variant>.ptr + type_id);
  if ((pSVar1->pointer == true) && (type_id = (pSVar1->parent_type).id, type_id == 0)) {
    __assert_fail("p_type->parent_type",
                  "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Cross/spirv_cross.cpp"
                  ,0x515,
                  "uint32_t diligent_spirv_cross::Compiler::get_pointee_type_id(uint32_t) const");
  }
  return type_id;
}

Assistant:

uint32_t Compiler::get_pointee_type_id(uint32_t type_id) const
{
	auto *p_type = &get<SPIRType>(type_id);
	if (p_type->pointer)
	{
		assert(p_type->parent_type);
		type_id = p_type->parent_type;
	}
	return type_id;
}